

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int hail(int n)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if (1 < n) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      uVar3 = n >> 1;
      uVar1 = n & 1;
      n = n * 3 + 1;
      if (uVar1 == 0) {
        n = uVar3;
      }
    } while (n != 1);
  }
  return iVar2;
}

Assistant:

int hail ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    HAIL computes the hail function.
//
//  Discussion:
//
//    Starting with a positive integer N, we divide it by 2 if it is
//    even, or triple and add 1 if odd, and repeat this process until
//    reaching the value 1.  The number of times the process is carried
//    out is the value of the hail function for the given starting value.
//
//    Actually, HAIL is not well defined, since it is not known if
//    the above process actually terminates, let alone terminates at 1,
//    for every starting value N.
//
//  Example:
//
//     N  Sequence                                                  Hail
//
//     1                                                               0
//     2   1                                                           1
//     3  10,  5, 16,  8,  4,  2,  1                                   7
//     4   2   1                                                       2
//     5  16,  8,  4,  2,  1                                           5
//     6   3, 10,  5, 16,  8,  4,  2,  1                               8
//     7  22, 11, 34, 17, 52, 26, 13, 40, 20, 10, 5, 16, 8, 4, 2, 1   16
//     8   4,  2,  1                                                   3
//     9  28, 14,  7, ...                                             19
//    10   5, 16,  8,  4,  2,  1                                       6
//    11  34, 17, 52, 26, 13, 40, 20, 10,  5, 16, 8, 4, 2, 1          14
//    12   6,  3, 10,  5, 16,  8,  4,  2,  1                           9
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the starting value for the hail sequence.
//
//    Output, int HAIL, the number of steps before the hail sequence
//    reached 1.
//
{
  int k;
  int m;

  k = 0;
  m = n;

  if ( 0 < n )
  {
    while ( m != 1 )
    {
      k = k + 1;
      if ( ( m % 2 ) == 0 )
      {
        m = m / 2;
      }
      else
      {
        m = 3 * m + 1;
      }
    }

  }

  return k;
}